

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O2

void __thiscall AgenPeeps::PeepFunc(AgenPeeps *this)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int bound;
  int iVar6;
  undefined4 *puVar7;
  Instr *blockStart;
  Instr *this_00;
  Instr *this_01;
  
  bVar3 = AutoSystemInfo::IsAtomPlatform(&AutoSystemInfo::Data);
  uVar4 = Func::GetSourceContextId(this->func);
  uVar5 = Func::GetLocalFunctionId(this->func);
  if (bVar3) {
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,AtomPhase,uVar4,uVar5);
    if (bVar3) {
      return;
    }
    uVar4 = Func::GetSourceContextId(this->func);
    uVar5 = Func::GetLocalFunctionId(this->func);
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,AgenPeepsPhase,uVar4,uVar5);
    if (bVar3) {
      return;
    }
  }
  else {
    bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,AtomPhase,uVar4,uVar5);
    if (!bVar3) {
      uVar4 = Func::GetSourceContextId(this->func);
      uVar5 = Func::GetLocalFunctionId(this->func);
      bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,AgenPeepsPhase,uVar4,uVar5);
      if (!bVar3) {
        return;
      }
    }
  }
  pIVar1 = this->func->m_headInstr;
  blockStart = (Instr *)0x0;
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  iVar6 = 0;
  do {
    do {
      do {
        while( true ) {
          do {
            bound = iVar6;
            this_01 = pIVar1;
            if (this_01 == (Instr *)0x0) {
              return;
            }
            pIVar1 = this_01->m_next;
            bVar3 = IR::Instr::IsRealInstr(this_01);
          } while (((!bVar3) && (this_01->m_kind != InstrKindProfiledLabel)) &&
                  (iVar6 = bound, this_01->m_kind != InstrKindLabel));
          bVar3 = IR::Instr::EndsBasicBlock(this_01);
          if ((!bVar3) && ((6 < this_01->m_kind || ((0x68U >> (this_01->m_kind & 0x1f) & 1) == 0))))
          break;
          blockStart = IR::Instr::GetNextRealInstr(this_01);
          pIVar1 = blockStart;
          iVar6 = 0;
        }
        this_00 = IR::Instr::GetNextRealInstrOrLabel(this_01);
        bVar3 = IR::Instr::EndsBasicBlock(this_00);
        iVar6 = 0;
      } while ((bVar3) ||
              ((this_00->m_kind < 7 && (iVar6 = 0, (0x68U >> (this_00->m_kind & 0x1f) & 1) != 0))));
      bVar3 = AgenDependentInstrs(this,this_01,this_00);
      iVar6 = 0;
    } while (!bVar3);
    if (blockStart == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/AgenPeeps.cpp"
                         ,0x3e,"(blockStart)","blockStart");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    iVar6 = MoveInstrUp(this,this_01,blockStart,bound);
    iVar6 = iVar6 + -3;
  } while( true );
}

Assistant:

void AgenPeeps::PeepFunc()
{
    int distance = 0;
    IR::Instr *blockStart, *nextRealInstr;
    const uint stall_cycles = 3;

    if (AutoSystemInfo::Data.IsAtomPlatform())
    {
        // On Atom, always optimize unless phase is off
        if (PHASE_OFF(Js::AtomPhase, func) || PHASE_OFF(Js::AgenPeepsPhase, func))
            return;
    }
    else
    {
        // On other platforms, don't optimize unless phase is forced
        if (!PHASE_FORCE(Js::AtomPhase, func) && !PHASE_FORCE(Js::AgenPeepsPhase, func))
            return;
    }

    blockStart = nullptr;
    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        if (!instr->IsRealInstr() && !instr->IsLabelInstr())
            continue;

        // BB boundary ?
        if (instr->EndsBasicBlock() || instr->StartsBasicBlock())
        {
            distance = 0;
            instrNext = blockStart = instr->GetNextRealInstr();
            continue;
        }
        nextRealInstr = instr->GetNextRealInstrOrLabel();
        // Check for AGEN dependency with the next instruction in the same BB
        if (!nextRealInstr->EndsBasicBlock() && !nextRealInstr->StartsBasicBlock() &&
            AgenDependentInstrs(instr, nextRealInstr))
        {
            Assert(blockStart);
            // Move instr up
            distance = MoveInstrUp(instr, blockStart, distance) - stall_cycles;
        } else
            distance = 0;

    } NEXT_INSTR_IN_FUNC_EDITING;
}